

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPrint.c
# Opt level: O1

void Fxu_MatrixPrintDivisorProfile(FILE *pFile,Fxu_Matrix *p)

{
  int *piVar1;
  size_t __size;
  int iVar2;
  uint uVar3;
  Fxu_ListDouble *pFVar4;
  int iVar5;
  void *__s;
  long lVar6;
  uint uVar7;
  Fxu_Double *pFVar8;
  uint uVar9;
  ulong uVar10;
  
  iVar5 = Fxu_HeapDoubleReadMaxWeight(p->pHeapDouble);
  __size = (long)iVar5 * 4 + 4;
  __s = malloc(__size);
  uVar7 = 0;
  memset(__s,0,__size);
  iVar2 = p->nTableSize;
  uVar9 = 0;
  if (0 < (long)iVar2) {
    pFVar4 = p->pTable;
    lVar6 = 0;
    uVar9 = 0;
    uVar7 = 0;
    do {
      for (pFVar8 = pFVar4[lVar6].pHead; pFVar8 != (Fxu_Double *)0x0; pFVar8 = pFVar8->pNext) {
        uVar3 = pFVar8->Weight;
        if (iVar5 < (int)uVar3) {
          __assert_fail("pDiv->Weight <= WeightMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuPrint.c"
                        ,0xb0,"void Fxu_MatrixPrintDivisorProfile(FILE *, Fxu_Matrix *)");
        }
        if (uVar3 == 0xffffffff) {
          uVar7 = uVar7 + 1;
        }
        else if ((int)uVar3 < 0) {
          uVar9 = uVar9 + 1;
        }
        else {
          piVar1 = (int *)((long)__s + (ulong)uVar3 * 4);
          *piVar1 = *piVar1 + 1;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar2);
  }
  fwrite("The double divisors profile:\n",0x1d,1,(FILE *)pFile);
  fprintf((FILE *)pFile,"Weight  < -1 divisors = %6d\n",(ulong)uVar9);
  fprintf((FILE *)pFile,"Weight    -1 divisors = %6d\n",(ulong)uVar7);
  if (-1 < iVar5) {
    uVar10 = 0;
    do {
      if (*(int *)((long)__s + uVar10 * 4) != 0) {
        fprintf((FILE *)pFile,"Weight   %3d divisors = %6d\n",uVar10 & 0xffffffff);
      }
      uVar10 = uVar10 + 1;
    } while (iVar5 + 1 != uVar10);
  }
  fwrite("End of divisor profile printout\n",0x20,1,(FILE *)pFile);
  if (__s != (void *)0x0) {
    free(__s);
    return;
  }
  return;
}

Assistant:

void Fxu_MatrixPrintDivisorProfile( FILE * pFile, Fxu_Matrix * p )
{
    Fxu_Double * pDiv;
    int WeightMax;
    int * pProfile;
    int Counter1; // the number of -1 weight
    int CounterL; // the number of less than -1 weight
    int i;

    WeightMax = Fxu_HeapDoubleReadMaxWeight( p->pHeapDouble );
    pProfile = ABC_ALLOC( int, (WeightMax + 1) );
    memset( pProfile, 0, sizeof(int) * (WeightMax + 1) );

    Counter1 = 0;
    CounterL = 0;
	Fxu_MatrixForEachDouble( p, pDiv, i )
    {
        assert( pDiv->Weight <= WeightMax );
        if ( pDiv->Weight == -1 )
            Counter1++;
        else if ( pDiv->Weight < 0 )
            CounterL++;
        else
            pProfile[ pDiv->Weight ]++;
    }

	fprintf( pFile, "The double divisors profile:\n" );
	fprintf( pFile, "Weight  < -1 divisors = %6d\n", CounterL );
	fprintf( pFile, "Weight    -1 divisors = %6d\n", Counter1 );
    for ( i = 0; i <= WeightMax; i++ )
        if ( pProfile[i] )
	        fprintf( pFile, "Weight   %3d divisors = %6d\n", i, pProfile[i] );
	fprintf( pFile, "End of divisor profile printout\n" );
    ABC_FREE( pProfile );
}